

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void __thiscall
SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::~SmallArray
          (SmallArray<LLVMBasicBlockRefOpaque_*,_16U> *this)

{
  LLVMBasicBlockRefOpaque **ppLVar1;
  
  ppLVar1 = this->data;
  if (ppLVar1 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (ppLVar1 != (LLVMBasicBlockRefOpaque **)0x0) {
        (*(code *)NULLC::dealloc)(ppLVar1);
      }
    }
    else if (ppLVar1 != (LLVMBasicBlockRefOpaque **)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  return;
}

Assistant:

~SmallArray()
	{
		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}
	}